

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

bool_t prf_matrix_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint n_bytes;
  uint16_t uVar1;
  float32_t *pfVar2;
  node_data_conflict8 *data;
  float32_t fVar3;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_matrix_info.opcode) {
    uVar1 = bf_get_uint16_be(bfile);
    node->length = uVar1;
    if (uVar1 < 0x44) {
      prf_error(9,"matrix node too short (%d bytes)");
    }
    else {
      pfVar2 = (float32_t *)node->data;
      if (pfVar2 != (float32_t *)0x0) {
LAB_00108621:
        fVar3 = bf_get_float32_be(bfile);
        *pfVar2 = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[4] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[8] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[0xc] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[1] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[5] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[9] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[0xd] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[2] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[6] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[10] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[0xe] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[3] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[7] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[0xb] = fVar3;
        fVar3 = bf_get_float32_be(bfile);
        pfVar2[0xf] = fVar3;
        if (node->length < 0x45) {
          return 1;
        }
        bf_read(bfile,node->data + 0x40,node->length - 0x44);
        return 1;
      }
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        pfVar2 = (float32_t *)malloc((ulong)(uVar1 - 4));
      }
      else {
        pfVar2 = (float32_t *)pool_malloc(pool_id,uVar1 - 4);
      }
      node->data = (uint8_t *)pfVar2;
      if (pfVar2 != (float32_t *)0x0) goto LAB_00108621;
      prf_error(9,"memory allocation problem (returned NULL)");
    }
    n_bytes = 4;
  }
  else {
    prf_error(9,"tried matrix node load method on node of type %d.",(ulong)uVar1);
    n_bytes = 2;
  }
  bf_rewind(bfile,n_bytes);
  return 0;
}

Assistant:

static
bool_t
prf_matrix_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_matrix_info.opcode ) {
        prf_error( 9,
            "tried matrix node load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < NODE_DATA_SIZE + 4 ) {
        prf_error( 9, "matrix node too short (%d bytes)", node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        data->matrix[0][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[0][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[0][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[0][3] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][3] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][3] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][3] = bf_get_float32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}